

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* args::Wrap(string *in,size_type width,size_type firstlinewidth)

{
  undefined1 uVar1;
  ulong firstlinewidth_00;
  move_iterator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  __first;
  iterator this;
  string *in_RCX;
  string *in_RDX;
  move_iterator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  in_RSI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  size_type itemsize;
  string item;
  size_type linesize;
  ostringstream line;
  istringstream stream;
  size_type currentwidth;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  second;
  size_type newlineloc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *output;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffffb08;
  string *in_stack_fffffffffffffb10;
  undefined7 in_stack_fffffffffffffb20;
  undefined1 in_stack_fffffffffffffb27;
  string *in_stack_fffffffffffffb30;
  const_iterator __position;
  string local_470 [32];
  string local_450 [32];
  string local_430 [32];
  size_type local_410;
  string local_408 [32];
  long local_3e8;
  ostringstream local_3e0 [383];
  byte local_261;
  long local_260 [48];
  string *local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b0;
  undefined1 local_99 [73];
  string local_50 [39];
  byte local_29;
  
  firstlinewidth_00 = std::__cxx11::string::find(SUB81(in_RSI._M_current._M_current,0),10);
  if (firstlinewidth_00 == 0xffffffffffffffff) {
    local_e0 = in_RCX;
    if (in_RCX == (string *)0x0) {
      local_e0 = in_RDX;
    }
    std::__cxx11::istringstream::istringstream
              ((istringstream *)local_260,in_RSI._M_current._M_current,8);
    local_261 = 0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x15dc15);
    std::__cxx11::ostringstream::ostringstream(local_3e0);
    local_3e8 = 0;
    while (uVar1 = std::ios::operator_cast_to_bool
                             ((ios *)((long)local_260 + *(long *)(local_260[0] + -0x18))),
          (bool)uVar1) {
      std::__cxx11::string::string(local_408);
      std::operator>>((istream *)local_260,local_408);
      local_410 = Glyphs(in_stack_fffffffffffffb30);
      if ((local_e0 < (string *)(local_3e8 + 1 + local_410)) && (local_3e8 != 0)) {
        std::__cxx11::ostringstream::str();
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffffb10,in_stack_fffffffffffffb08._M_current);
        std::__cxx11::string::~string(local_430);
        in_stack_fffffffffffffb10 = local_450;
        std::__cxx11::string::string(in_stack_fffffffffffffb10);
        std::__cxx11::ostringstream::str((string *)local_3e0);
        local_e0 = in_RDX;
        std::__cxx11::string::~string(local_450);
        local_3e8 = 0;
        in_RDX = local_e0;
      }
      if (local_410 != 0) {
        if (local_3e8 != 0) {
          local_3e8 = local_3e8 + 1;
          std::operator<<((ostream *)local_3e0," ");
        }
        std::operator<<((ostream *)local_3e0,local_408);
        local_3e8 = local_410 + local_3e8;
      }
      std::__cxx11::string::~string(local_408);
    }
    if (local_3e8 != 0) {
      std::__cxx11::ostringstream::str();
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffb10,in_stack_fffffffffffffb08._M_current);
      std::__cxx11::string::~string(local_470);
    }
    local_261 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_3e0);
    if ((local_261 & 1) == 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)CONCAT17(uVar1,in_stack_fffffffffffffb20));
    }
    std::__cxx11::istringstream::~istringstream((istringstream *)local_260);
  }
  else {
    local_29 = 0;
    std::__cxx11::string::string
              (local_50,(string *)in_RSI._M_current._M_current,0,firstlinewidth_00);
    Wrap(in_RDX,(size_type)in_RCX,firstlinewidth_00);
    std::__cxx11::string::~string(local_50);
    __first._M_current._M_current =
         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          )(firstlinewidth_00 + 1);
    __position._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_99;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_99 + 1),(string *)in_RSI._M_current._M_current,
               (ulong)__first._M_current._M_current,(allocator *)__position._M_current);
    Wrap(in_RDX,(size_type)in_RCX,firstlinewidth_00);
    std::__cxx11::string::~string((string *)(local_99 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_99);
    this = std::end<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                     (in_stack_fffffffffffffb08._M_current);
    local_b0 = this._M_current;
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)in_stack_fffffffffffffb10,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)in_stack_fffffffffffffb08._M_current);
    local_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::begin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                         (in_stack_fffffffffffffb08._M_current);
    local_b8._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         make_move_iterator<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                   (in_stack_fffffffffffffb08);
    local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::end<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                         (in_stack_fffffffffffffb08._M_current);
    local_c8._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         make_move_iterator<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                   (in_stack_fffffffffffffb08);
    local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
               insert<std::move_iterator<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,void>
                         (this._M_current,__position,__first,in_RSI);
    local_29 = 1;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)CONCAT17(in_stack_fffffffffffffb27,in_stack_fffffffffffffb20));
    if ((local_29 & 1) == 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)CONCAT17(in_stack_fffffffffffffb27,in_stack_fffffffffffffb20));
    }
  }
  return in_RDI;
}

Assistant:

std::vector<std::string> Wrap(const std::string &in, const std::string::size_type width, std::string::size_type firstlinewidth = 0)
    {
        // Preserve existing line breaks
        const auto newlineloc = in.find('\n');
        if (newlineloc != in.npos)
        {
            auto first = Wrap(std::string(in, 0, newlineloc), width);
            auto second = Wrap(std::string(in, newlineloc + 1), width);
            first.insert(
                std::end(first),
                std::make_move_iterator(std::begin(second)),
                std::make_move_iterator(std::end(second)));
            return first;
        }
        if (firstlinewidth == 0)
        {
            firstlinewidth = width;
        }
        auto currentwidth = firstlinewidth;

        std::istringstream stream(in);
        std::vector<std::string> output;
        std::ostringstream line;
        std::string::size_type linesize = 0;
        while (stream)
        {
            std::string item;
            stream >> item;
            auto itemsize = Glyphs(item);
            if ((linesize + 1 + itemsize) > currentwidth)
            {
                if (linesize > 0)
                {
                    output.push_back(line.str());
                    line.str(std::string());
                    linesize = 0;
                    currentwidth = width;
                }
            }
            if (itemsize > 0)
            {
                if (linesize)
                {
                    ++linesize;
                    line << " ";
                }
                line << item;
                linesize += itemsize;
            }
        }
        if (linesize > 0)
        {
            output.push_back(line.str());
        }
        return output;
    }